

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_data_skip(archive *_a)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int64_t offset;
  size_t size;
  void *buff;
  la_int64_t lStack_38;
  size_t local_30;
  void *local_28;
  
  iVar2 = __archive_check_magic(_a,0xdeb0c5,4,"archive_read_data_skip");
  iVar3 = -0x1e;
  if (iVar2 != -0x1e) {
    pcVar1 = *(code **)(_a[0xe].error_string.length + 0x30);
    if (pcVar1 == (code *)0x0) {
      do {
        iVar2 = archive_read_data_block(_a,&local_28,&local_30,&lStack_38);
      } while (iVar2 == 0);
    }
    else {
      iVar2 = (*pcVar1)(_a);
    }
    iVar3 = 0;
    if (iVar2 != 1) {
      iVar3 = iVar2;
    }
    _a->state = 2;
  }
  return iVar3;
}

Assistant:

int
archive_read_data_skip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r;
	const void *buff;
	size_t size;
	int64_t offset;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_skip");

	if (a->format->read_data_skip != NULL)
		r = (a->format->read_data_skip)(a);
	else {
		while ((r = archive_read_data_block(&a->archive,
			    &buff, &size, &offset))
		    == ARCHIVE_OK)
			;
	}

	if (r == ARCHIVE_EOF)
		r = ARCHIVE_OK;

	a->archive.state = ARCHIVE_STATE_HEADER;
	return (r);
}